

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_io.c
# Opt level: O1

ssize_t tnt_io_send_raw(tnt_stream_net *s,char *buf,size_t size,int all)

{
  tnt_iob_tx_t p_Var1;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  
  sVar4 = 0;
  do {
    p_Var1 = (s->sbuf).tx;
    if (p_Var1 == (tnt_iob_tx_t)0x0) {
      do {
        sVar2 = send(s->fd,buf + sVar4,size - sVar4,0);
        if (sVar2 != -1) goto LAB_0010851b;
        piVar3 = __errno_location();
      } while (*piVar3 == 4);
      sVar2 = -1;
    }
    else {
      sVar2 = (*p_Var1)(&s->sbuf,buf + sVar4,size - sVar4);
    }
LAB_0010851b:
    if (sVar2 < 1) {
      s->error = TNT_ESYSTEM;
      piVar3 = __errno_location();
      s->errno_ = *piVar3;
      return -1;
    }
    sVar4 = sVar4 + sVar2;
    if (all == 0) {
      return sVar4;
    }
    if (sVar4 == size) {
      return sVar4;
    }
  } while( true );
}

Assistant:

ssize_t
tnt_io_send_raw(struct tnt_stream_net *s, const char *buf, size_t size, int all)
{
	size_t off = 0;
	do {
		ssize_t r;
		if (s->sbuf.tx) {
			r = s->sbuf.tx(&s->sbuf, buf + off, size - off);
		} else {
			do {
				r = send(s->fd, buf + off, size - off, 0);
			} while (r == -1 && (errno == EINTR));
		}
		if (r <= 0) {
			s->error = TNT_ESYSTEM;
			s->errno_ = errno;
			return -1;
		}
		off += r;
	} while (off != size && all);
	return off;
}